

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_cm.c
# Opt level: O0

int isobusfs_srv_request_volume
              (isobusfs_srv_priv *priv,isobusfs_srv_client *client,isobusfs_srv_volume *volume)

{
  uint j;
  isobusfs_srv_volume *volume_local;
  isobusfs_srv_client *client_local;
  isobusfs_srv_priv *priv_local;
  
  for (j = 0; j < 0xed; j = j + 1) {
    if (volume->clients[j] == client) {
      return 0;
    }
  }
  j = 0;
  while( true ) {
    if (0xec < j) {
      return -2;
    }
    if (volume->clients[j] == (isobusfs_srv_client *)0x0) break;
    j = j + 1;
  }
  volume->clients[j] = client;
  volume->refcount = volume->refcount + 1;
  return 0;
}

Assistant:

int isobusfs_srv_request_volume(struct isobusfs_srv_priv *priv,
				struct isobusfs_srv_client *client,
				struct isobusfs_srv_volume *volume)
{
	unsigned int j;

	/* Check if the client already requested this volume */
	for (j = 0; j < ARRAY_SIZE(volume->clients); j++) {
		if (volume->clients[j] == client) {
			/* Client already requested this volume, do not
			 * increase refcount 
			 */
			return 0;
		}
	}

	/* Add client to the volume's client list and increase refcount */
	for (j = 0; j < ARRAY_SIZE(volume->clients); j++) {
		if (volume->clients[j] == NULL) {
			volume->clients[j] = client;
			volume->refcount++;
			return 0;
		}
	}

	return -ENOENT;
}